

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

unsigned_long mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(undefined8 x,long param_2)

{
  unsigned_long result;
  custom_op<unsigned_long,_true> op;
  
  custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&op);
  MPI_Allreduce(x,&result,1,op.m_type_copy,op.m_op,*(undefined8 *)(param_2 + 8));
  custom_op<unsigned_long,_true>::~custom_op(&op);
  return result;
}

Assistant:

inline T allreduce(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get custom op (and type for custom op)
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Allreduce(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    return result;
}